

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall Tigre::String::aleatorio(String *__return_storage_ptr__,String *this,int len)

{
  long lVar1;
  String *this_00;
  char *s;
  int iVar2;
  undefined8 uStack_a0;
  String *local_98;
  String *local_90;
  char *local_88;
  int local_7c;
  ulong uStack_78;
  int i;
  unsigned_long __vla_expr0;
  char acStack_68 [8];
  char alfabeto [64];
  int len_local;
  String *this_local;
  
  __vla_expr0 = (unsigned_long)&local_98;
  builtin_strncpy(alfabeto + 0x28,"mnopqrstuvwxyz*#",0x10);
  builtin_strncpy(alfabeto + 0x18,"WXYXabcdefghijkl",0x10);
  builtin_strncpy(alfabeto + 8,"GHIJKLMNOPQRSTUV",0x10);
  builtin_strncpy(acStack_68,"01234567",8);
  builtin_strncpy(alfabeto,"89ABCDEF",8);
  uStack_78 = (ulong)(len + 1);
  lVar1 = -(uStack_78 + 0xf & 0xfffffffffffffff0);
  local_88 = (char *)((long)&local_98 + lVar1);
  local_98 = __return_storage_ptr__;
  local_90 = __return_storage_ptr__;
  for (local_7c = 0; s = local_88, this_00 = local_98, local_7c < len; local_7c = local_7c + 1) {
    *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x1038af;
    iVar2 = rand();
    local_88[local_7c] = alfabeto[(long)(iVar2 % 0x40) + -8];
  }
  local_88[len] = '\0';
  *(undefined8 *)((long)&uStack_a0 + lVar1) = 0x1038ec;
  String(this_00,s);
  return local_90;
}

Assistant:

Tigre::String Tigre::String::aleatorio(int len) {
    char alfabeto[] = {
            '0', '1', '2', '3', '4', '5', '6', '7',
            '8', '9', 'A', 'B', 'C', 'D', 'E', 'F',
            'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N',
            'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V',
            'W', 'X', 'Y', 'X', 'a', 'b', 'c', 'd',
            'e', 'f', 'g', 'h', 'i', 'j', 'k', 'l',
            'm', 'n', 'o', 'p', 'q', 'r', 's', 't',
            'u', 'v', 'w', 'x', 'y', 'z', '*', '#'
    };

    char palavra[len+1];

    for (int i = 0; i < len; i++) {
        palavra[i] = alfabeto[ rand() % 64 ]; /* 62 é o tamanho do alfabeto */
    }

    palavra[len] = '\0';

    return palavra;
}